

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall Clasp::Solver::inDegree(Solver *this,WeightLitVec *out)

{
  bool bVar1;
  uint32 uVar2;
  Type TVar3;
  reference pLVar4;
  Antecedent *pAVar5;
  size_type n;
  Solver *in_RSI;
  long in_RDI;
  const_iterator it;
  Antecedent xAnte;
  uint32 xIn;
  uint32 xLev;
  Literal x;
  LitVec temp;
  uint32 stop;
  uint32 i;
  uint32 maxIn;
  uint *in_stack_ffffffffffffff08;
  Solver *in_stack_ffffffffffffff10;
  uint32 in_stack_ffffffffffffff18;
  Var in_stack_ffffffffffffff1c;
  Solver *this_00;
  Solver *in_stack_ffffffffffffff28;
  Solver *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff3c;
  Literal p;
  pair<Clasp::Literal,_int> local_78;
  Solver *local_70;
  uint32 local_64;
  Antecedent local_60;
  uint local_54;
  uint32 local_50;
  Literal local_3c;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_38;
  uint32 local_24;
  uint32 local_20;
  uint local_1c;
  Solver *local_18;
  uint32 local_4;
  
  local_18 = in_RSI;
  uVar2 = decisionLevel((Solver *)0x1ebee9);
  if (uVar2 == 0) {
    local_4 = 1;
  }
  else {
    numAssignedVars((Solver *)0x1ebf15);
    levelStart(in_stack_ffffffffffffff10,(uint32)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    reserve((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             *)in_stack_ffffffffffffff30,(size_type)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_1c = 1;
    local_20 = sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1ebf61);
    local_24 = levelStart(in_stack_ffffffffffffff10,
                          (uint32)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               in_stack_ffffffffffffff30);
    while (n = local_20 - 1, local_20 != local_24) {
      local_20 = n;
      pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          (in_RDI + 200),n);
      local_3c.rep_ = pLVar4->rep_;
      Literal::var(&local_3c);
      local_50 = Assignment::level((Assignment *)in_stack_ffffffffffffff10,
                                   (Var)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      local_54 = 0;
      Literal::var(&local_3c);
      pAVar5 = Assignment::reason((Assignment *)in_stack_ffffffffffffff10,
                                  (Var)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      local_60.data_ = pAVar5->data_;
      bVar1 = Antecedent::isNull(&local_60);
      p.rep_ = (uint32)((ulong)pAVar5 >> 0x20);
      in_stack_ffffffffffffff3c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
      if ((!bVar1) && (TVar3 = Antecedent::type(&local_60), TVar3 != Binary)) {
        local_64 = local_3c.rep_;
        Antecedent::reason((Antecedent *)CONCAT44(in_stack_ffffffffffffff3c,TVar3),
                           in_stack_ffffffffffffff30,p,(LitVec *)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff30 =
             (Solver *)
             bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin(&local_38);
        local_70 = in_stack_ffffffffffffff30;
        while (this_00 = local_70,
              in_stack_ffffffffffffff28 =
                   (Solver *)
                   bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                             (&local_38), this_00 != in_stack_ffffffffffffff28) {
          in_stack_ffffffffffffff1c = Literal::var((Literal *)local_70);
          in_stack_ffffffffffffff18 =
               level(in_stack_ffffffffffffff10,(Var)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          local_54 = (in_stack_ffffffffffffff18 != local_50) + local_54;
          local_70 = (Solver *)&local_70->field_0x4;
        }
        if (local_54 != 0) {
          in_stack_ffffffffffffff10 = local_18;
          std::pair<Clasp::Literal,_int>::pair<Clasp::Literal_&,_unsigned_int_&,_true>
                    (&local_78,&local_3c,&local_54);
          bk_lib::
          pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
          ::push_back((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                       *)this_00,
                      (pair<Clasp::Literal,_int> *)
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          in_stack_ffffffffffffff08 = std::max<unsigned_int>(&local_54,&local_1c);
          local_1c = *in_stack_ffffffffffffff08;
        }
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear(&local_38);
      }
    }
    local_20 = n;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1ebfb4);
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

uint32 Solver::inDegree(WeightLitVec& out) {
	if (decisionLevel() == 0) { return 1; }
	assert(!hasConflict());
	out.reserve((numAssignedVars()-levelStart(1))/10);
	uint32 maxIn = 1;
	uint32 i = sizeVec(assign_.trail), stop = levelStart(1);
	for (LitVec temp; i-- != stop; ) {
		Literal x    = assign_.trail[i];
		uint32  xLev = assign_.level(x.var());
		uint32  xIn  = 0;
		Antecedent xAnte = assign_.reason(x.var());
		if (!xAnte.isNull() && xAnte.type() != Antecedent::Binary) {
			xAnte.reason(*this, x, temp);
			for (LitVec::const_iterator it = temp.begin(); it != temp.end(); ++it) {
				xIn += level(it->var()) != xLev;
			}
			if (xIn) {
				out.push_back(WeightLiteral(x, xIn));
				maxIn = std::max(xIn, maxIn);
			}
			temp.clear();
		}
	}
	return maxIn;
}